

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void DeleteIntervalList(CostManager *manager,CostInterval *interval)

{
  CostInterval *pCVar1;
  int iVar2;
  CostInterval *in_RSI;
  CostManager *in_RDI;
  CostInterval *next;
  CostInterval *local_10;
  
  local_10 = in_RSI;
  while (local_10 != (CostInterval *)0x0) {
    pCVar1 = local_10->next;
    iVar2 = CostIntervalIsInFreeList(in_RDI,local_10);
    local_10 = pCVar1;
    if (iVar2 == 0) {
      WebPSafeFree((void *)0x1a3761);
    }
  }
  return;
}

Assistant:

static void DeleteIntervalList(CostManager* const manager,
                               const CostInterval* interval) {
  while (interval != NULL) {
    const CostInterval* const next = interval->next;
    if (!CostIntervalIsInFreeList(manager, interval)) {
      WebPSafeFree((void*)interval);
    }  // else: do nothing
    interval = next;
  }
}